

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint unfilter(uchar *out,uchar *in,uint w,uint h,uint bpp)

{
  ulong uVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  undefined1 auVar11 [16];
  uchar uVar12;
  uchar uVar13;
  uchar uVar14;
  uchar uVar15;
  uint uVar16;
  ulong uVar17;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  undefined7 extraout_var_02;
  long lVar18;
  ulong uVar19;
  uchar *puVar20;
  long lVar21;
  uchar *puVar22;
  uchar *puVar23;
  size_t j;
  long lVar24;
  uchar *puVar25;
  uchar *puVar26;
  ulong uVar27;
  long local_90;
  uchar *local_78;
  uchar *local_70;
  
  uVar16 = bpp + 7;
  uVar27 = (ulong)(uVar16 >> 3);
  lVar21 = (ulong)bpp * (ulong)(w >> 3);
  uVar19 = (ulong)((w & 7) * bpp + 7 >> 3);
  uVar1 = lVar21 + uVar19;
  lVar21 = lVar21 + uVar19 + 1;
  puVar22 = in + 1;
  local_78 = in + 3;
  lVar18 = -uVar27;
  local_90 = (long)out - uVar27;
  local_70 = in + 4;
  puVar23 = out + uVar27;
  puVar20 = in + uVar27 + 1;
  puVar26 = (uchar *)0x0;
  puVar25 = out;
  for (uVar19 = 0; uVar19 != h; uVar19 = uVar19 + 1) {
    switch(in[lVar21 * uVar19]) {
    case '\0':
      for (uVar17 = 0; uVar1 != uVar17; uVar17 = uVar17 + 1) {
        puVar25[uVar17] = puVar22[uVar17];
      }
      break;
    case '\x01':
      for (uVar17 = 0; uVar27 != uVar17; uVar17 = uVar17 + 1) {
        puVar25[uVar17] = puVar22[uVar17];
      }
      for (lVar24 = 0; uVar27 + lVar24 < uVar1; lVar24 = lVar24 + 1) {
        puVar23[lVar24] = puVar25[lVar24] + puVar20[lVar24];
      }
      break;
    case '\x02':
      uVar17 = 0;
      if (puVar26 == (uchar *)0x0) {
        for (; uVar1 != uVar17; uVar17 = uVar17 + 1) {
          puVar25[uVar17] = puVar22[uVar17];
        }
      }
      else {
        for (; uVar1 != uVar17; uVar17 = uVar17 + 1) {
          puVar25[uVar17] = puVar26[uVar17] + puVar22[uVar17];
        }
      }
      break;
    case '\x03':
      uVar17 = 0;
      if (puVar26 == (uchar *)0x0) {
        for (; uVar27 != uVar17; uVar17 = uVar17 + 1) {
          puVar25[uVar17] = puVar22[uVar17];
        }
        for (lVar24 = 0; uVar27 + lVar24 < uVar1; lVar24 = lVar24 + 1) {
          puVar23[lVar24] = (puVar25[lVar24] >> 1) + puVar20[lVar24];
        }
      }
      else {
        for (; uVar27 != uVar17; uVar17 = uVar17 + 1) {
          puVar25[uVar17] = (puVar26[uVar17] >> 1) + puVar22[uVar17];
        }
        for (lVar24 = 0; uVar27 + lVar24 < uVar1; lVar24 = lVar24 + 1) {
          puVar23[lVar24] =
               (char)((uint)puVar26[lVar24 + uVar27] + (uint)puVar25[lVar24] >> 1) + puVar20[lVar24]
          ;
        }
      }
      break;
    case '\x04':
      uVar17 = 0;
      if (puVar26 == (uchar *)0x0) {
        for (; uVar27 != uVar17; uVar17 = uVar17 + 1) {
          puVar25[uVar17] = puVar22[uVar17];
        }
        for (lVar24 = 0; uVar27 + lVar24 < uVar1; lVar24 = lVar24 + 1) {
          puVar23[lVar24] = puVar25[lVar24] + puVar20[lVar24];
        }
      }
      else {
        for (; uVar27 != uVar17; uVar17 = uVar17 + 1) {
          puVar25[uVar17] = puVar26[uVar17] + puVar22[uVar17];
        }
        if (uVar16 < 0x20) {
          if (uVar16 >> 3 == 3) {
            for (uVar17 = 3; uVar17 + 2 < uVar1; uVar17 = uVar17 + 3) {
              uVar12 = local_70[uVar17 - 3];
              uVar13 = local_70[uVar17 - 2];
              uVar14 = local_70[uVar17 - 1];
              bVar2 = puVar25[uVar17 - 2];
              bVar3 = puVar25[uVar17 - 1];
              bVar4 = puVar26[uVar17 + 1];
              bVar5 = puVar26[uVar17 + 2];
              bVar6 = puVar26[uVar17 - 2];
              bVar7 = puVar26[uVar17 - 1];
              uVar15 = paethPredictor((ushort)puVar25[uVar17 - 3],(ushort)puVar26[uVar17],
                                      (ushort)puVar26[uVar17 - 3]);
              puVar25[uVar17] = uVar15 + uVar12;
              uVar12 = paethPredictor((ushort)bVar2,(ushort)bVar4,(ushort)bVar6);
              puVar25[uVar17 + 1] = uVar12 + uVar13;
              uVar12 = paethPredictor((ushort)bVar3,(ushort)bVar5,(ushort)bVar7);
              puVar25[uVar17 + 2] = uVar12 + uVar14;
            }
          }
          else {
            uVar17 = uVar27;
            if (0xf < uVar16) {
              for (uVar17 = 2; uVar17 + 1 < uVar1; uVar17 = uVar17 + 2) {
                uVar12 = local_78[uVar17 - 2];
                uVar13 = local_78[uVar17 - 1];
                bVar2 = *(byte *)(local_90 + 1 + uVar17);
                bVar3 = puVar26[uVar17 + 1];
                bVar4 = puVar26[uVar17 + lVar18 + 1];
                uVar14 = paethPredictor((ushort)*(byte *)(local_90 + uVar17),(ushort)puVar26[uVar17]
                                        ,(ushort)puVar26[uVar17 + lVar18]);
                puVar25[uVar17] = uVar14 + uVar12;
                uVar12 = paethPredictor((ushort)bVar2,(ushort)bVar3,(ushort)bVar4);
                puVar25[uVar17 + 1] = uVar12 + uVar13;
              }
            }
          }
        }
        else {
          for (lVar24 = 0; uVar27 + lVar24 + 3 < uVar1; lVar24 = lVar24 + 4) {
            bVar2 = puVar25[lVar24 + 1];
            bVar3 = puVar25[lVar24 + 2];
            bVar4 = puVar25[lVar24 + 3];
            bVar5 = puVar26[lVar24 + uVar27 + 1];
            bVar6 = puVar26[lVar24 + uVar27 + 2];
            bVar7 = puVar26[lVar24 + uVar27 + 3];
            bVar8 = puVar26[lVar24 + 1];
            bVar9 = puVar26[lVar24 + 2];
            bVar10 = puVar26[lVar24 + 3];
            uVar12 = paethPredictor((ushort)puVar25[lVar24],(ushort)puVar26[lVar24 + uVar27],
                                    (ushort)puVar26[lVar24]);
            uVar13 = paethPredictor((ushort)bVar2,(ushort)bVar5,(ushort)bVar8);
            uVar14 = paethPredictor((ushort)bVar3,(ushort)bVar6,(ushort)bVar9);
            uVar15 = paethPredictor((ushort)bVar4,(ushort)bVar7,(ushort)bVar10);
            auVar11 = vpinsrb_avx(ZEXT416((uint)CONCAT71(extraout_var,uVar12)),
                                  (int)CONCAT71(extraout_var_00,uVar13),1);
            auVar11 = vpinsrb_avx(auVar11,(int)CONCAT71(extraout_var_01,uVar14),2);
            auVar11 = vpinsrb_avx(auVar11,(int)CONCAT71(extraout_var_02,uVar15),3);
            auVar11 = vpaddb_avx(auVar11,ZEXT416(*(uint *)(puVar20 + lVar24)));
            *(int *)(puVar23 + lVar24) = auVar11._0_4_;
          }
          uVar17 = lVar24 + uVar27;
        }
        for (; uVar1 != uVar17; uVar17 = uVar17 + 1) {
          uVar12 = puVar22[uVar17];
          uVar13 = paethPredictor((ushort)*(byte *)(local_90 + uVar17),(ushort)puVar26[uVar17],
                                  (ushort)puVar26[uVar17 + lVar18]);
          puVar25[uVar17] = uVar13 + uVar12;
        }
      }
      break;
    default:
      return 0x24;
    }
    puVar26 = out + uVar1 * uVar19;
    puVar25 = puVar25 + uVar1;
    puVar22 = puVar22 + lVar21;
    local_78 = local_78 + lVar21;
    local_90 = local_90 + uVar1;
    local_70 = local_70 + lVar21;
    puVar23 = puVar23 + uVar1;
    puVar20 = puVar20 + lVar21;
  }
  return 0;
}

Assistant:

static unsigned unfilter(unsigned char* out, const unsigned char* in, unsigned w, unsigned h, unsigned bpp) {
  /*
  For PNG filter method 0
  this function unfilters a single image (e.g. without interlacing this is called once, with Adam7 seven times)
  out must have enough bytes allocated already, in must have the scanlines + 1 filtertype byte per scanline
  w and h are image dimensions or dimensions of reduced image, bpp is bits per pixel
  in and out are allowed to be the same memory address (but aren't the same size since in has the extra filter bytes)
  */

  unsigned y;
  unsigned char* prevline = 0;

  /*bytewidth is used for filtering, is 1 when bpp < 8, number of bytes per pixel otherwise*/
  size_t bytewidth = (bpp + 7u) / 8u;
  /*the width of a scanline in bytes, not including the filter type*/
  size_t linebytes = lodepng_get_raw_size_idat(w, 1, bpp) - 1u;

  for (y = 0; y < h; ++y) {
    size_t outindex = linebytes * y;
    size_t inindex = (1 + linebytes) * y; /*the extra filterbyte added to each row*/
    unsigned char filterType = in[inindex];

    CERROR_TRY_RETURN(unfilterScanline(&out[outindex], &in[inindex + 1], prevline, bytewidth, filterType, linebytes));

    prevline = &out[outindex];
  }

  return 0;
}